

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clock_updates.cc
# Opt level: O2

clock_update_t *
tchecker::operator+(clock_update_t *__return_storage_ptr__,clock_update_t *u,
                   shared_ptr<const_tchecker::expression_t> *expr)

{
  clock_id_t clock_id;
  undefined1 local_44 [12];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_38;
  shared_ptr<const_tchecker::expression_t> local_30;
  
  clock_id = u->_clock_id;
  local_44._0_4_ = 8;
  std::
  make_shared<tchecker::binary_expression_t,tchecker::binary_operator_t,std::shared_ptr<tchecker::expression_t_const>const&,std::shared_ptr<tchecker::expression_t_const>const&>
            ((binary_operator_t *)(local_44 + 4),
             (shared_ptr<const_tchecker::expression_t> *)local_44,&u->_value);
  if ((long *)local_44._4_8_ == (long *)0x0) {
    local_30.super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
  }
  else {
    local_30.super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)(local_44._4_8_ + *(long *)(*(long *)local_44._4_8_ + -0x38));
  }
  local_30.super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Stack_38._M_pi;
  local_44._4_8_ = 0;
  _Stack_38._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  clock_update_t::clock_update_t(__return_storage_ptr__,clock_id,&local_30);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_30.super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_38);
  return __return_storage_ptr__;
}

Assistant:

tchecker::clock_update_t operator+(tchecker::clock_update_t const & u,
                                   std::shared_ptr<tchecker::expression_t const> const & expr)
{
  return tchecker::clock_update_t{u._clock_id,
                                  std::make_shared<tchecker::binary_expression_t>(tchecker::EXPR_OP_PLUS, u._value, expr)};
}